

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  ulong uVar2;
  Value *in_RCX;
  ValueHolder in_RDX;
  size_t in_RSI;
  Value *in_RDI;
  byte in_R8B;
  Token token;
  bool successful;
  Token *in_stack_ffffffffffffff28;
  OurReader *in_stack_ffffffffffffff30;
  CommentPlacement placement;
  allocator *paVar3;
  string *in_stack_ffffffffffffff38;
  allocator local_b1;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
  *in_stack_ffffffffffffff50;
  allocator local_79;
  Location in_stack_ffffffffffffff88;
  Token *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  OurReader *in_stack_ffffffffffffffa0;
  int local_58;
  bool local_29;
  bool local_1;
  
  local_29 = (bool)(in_R8B & 1);
  if ((in_RDI[6].start_ & 0x100000000) == 0) {
    local_29 = false;
  }
  in_RDI[4].limit_ = in_RSI;
  in_RDI[5].value_ = in_RDX;
  in_RDI[7].value_.bool_ = local_29;
  *(size_t *)&in_RDI[5].field_0x8 = in_RDI[4].limit_;
  in_RDI[5].comments_ = (CommentInfo *)0x0;
  in_RDI[5].start_ = 0;
  std::__cxx11::string::operator=((string *)&in_RDI[5].limit_,"");
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (in_stack_ffffffffffffff50);
  while (bVar1 = std::
                 stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
                 empty((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>
                        *)0x14b152), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x14b164);
  }
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
            (&in_stack_ffffffffffffff30->nodes_,(value_type *)in_stack_ffffffffffffff28);
  *(undefined4 *)&in_RDI[6].start_ = 0;
  local_1 = readValue(this);
  skipCommentTokens(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  placement = (CommentPlacement)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if ((((in_RDI[6].limit_ & 0x100) == 0) || (local_58 == 0xd)) || (local_58 == 0)) {
    if (((in_RDI[7].value_.bool_ & 1U) != 0) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      Value::setComment(in_RDI,in_stack_ffffffffffffff38,placement);
    }
    if ((((in_RDI[6].start_ & 0x10000000000) != 0) && (bVar1 = Value::isArray(in_RCX), !bVar1)) &&
       (bVar1 = Value::isObject(in_RCX), !bVar1)) {
      paVar3 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff50,
                 "A valid JSON document must be either an array or an object value.",paVar3);
      addError(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      local_1 = false;
    }
  }
  else {
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,"Extra non-whitespace after JSON value.",paVar3);
    addError(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_ = "";
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  stackDepth_ = 0;
  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_) {
    if (token.type_ != tokenError && token.type_ != tokenEndOfStream) {
      addError("Extra non-whitespace after JSON value.", token);
      return false;
    }
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}